

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int conn_upkeep(connectdata *conn,void *param)

{
  _func_uint_connectdata_ptr_uint *p_Var1;
  
  p_Var1 = conn->handler->connection_check;
  if (p_Var1 != (_func_uint_connectdata_ptr_uint *)0x0) {
    (*p_Var1)(conn,2);
  }
  return 0;
}

Assistant:

static int conn_upkeep(struct connectdata *conn,
                       void *param)
{
  /* Param is unused. */
  (void)param;

  if(conn->handler->connection_check) {
    /* Do a protocol-specific keepalive check on the connection. */
    conn->handler->connection_check(conn, CONNCHECK_KEEPALIVE);
  }

  return 0; /* continue iteration */
}